

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execute_case.cpp
# Opt level: O0

void __thiscall
duckdb::ExpressionExecutor::FillSwitch
          (ExpressionExecutor *this,Vector *vector,Vector *result,SelectionVector *sel,sel_t count)

{
  PhysicalType PVar1;
  LogicalType *this_00;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
  *this_01;
  size_type sVar2;
  idx_t iVar3;
  list_entry_t *plVar4;
  undefined8 uVar5;
  Vector *in_RCX;
  Vector *in_RDX;
  ExpressionExecutor *in_RSI;
  uint in_R8D;
  idx_t result_idx;
  idx_t i_1;
  list_entry_t *result_data;
  Vector *list_child;
  idx_t offset;
  idx_t i;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *result_entries;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *vector_entries;
  LogicalType *in_stack_000004f8;
  Vector *in_stack_fffffffffffffee8;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *in_stack_fffffffffffffef0;
  Vector *in_stack_fffffffffffffef8;
  Vector *in_stack_ffffffffffffff00;
  allocator *paVar6;
  Vector *in_stack_ffffffffffffff18;
  Vector *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  string *in_stack_ffffffffffffff58;
  NotImplementedException *in_stack_ffffffffffffff60;
  allocator aStack_89;
  string asStack_88 [36];
  sel_t count_00;
  SelectionVector *in_stack_ffffffffffffffa0;
  Vector *in_stack_ffffffffffffffa8;
  Vector *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  SelectionVector *in_stack_ffffffffffffffc0;
  ulong uVar7;
  ulong uVar8;
  Vector *in_stack_ffffffffffffffc8;
  sel_t sVar9;
  Vector *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  
  sVar9 = (sel_t)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  this_00 = Vector::GetType(in_RDX);
  PVar1 = LogicalType::InternalType(this_00);
  switch(PVar1) {
  case BOOL:
  case INT8:
    TemplatedFillLoop<signed_char>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,sVar9);
    break;
  case UINT8:
    TemplatedFillLoop<unsigned_char>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,sVar9);
    break;
  case UINT16:
    TemplatedFillLoop<unsigned_short>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,sVar9);
    break;
  case INT16:
    TemplatedFillLoop<short>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,sVar9);
    break;
  case UINT32:
    TemplatedFillLoop<unsigned_int>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,sVar9);
    break;
  case INT32:
    TemplatedFillLoop<int>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,sVar9);
    break;
  case UINT64:
    TemplatedFillLoop<unsigned_long>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,sVar9);
    break;
  case INT64:
    TemplatedFillLoop<long>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,sVar9);
    break;
  case FLOAT:
    TemplatedFillLoop<float>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,sVar9);
    break;
  case DOUBLE:
    TemplatedFillLoop<double>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,sVar9);
    break;
  case INTERVAL:
    TemplatedFillLoop<duckdb::interval_t>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,sVar9);
    break;
  case LIST:
    iVar3 = ListVector::GetListSize(in_stack_fffffffffffffee8);
    sVar9 = (sel_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
    ListVector::GetEntry((Vector *)0x2e1ebad);
    ListVector::GetListSize(in_stack_fffffffffffffee8);
    ListVector::Append(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                       (idx_t)in_stack_fffffffffffffef0,(idx_t)in_stack_fffffffffffffee8);
    TemplatedFillLoop<duckdb::list_entry_t>
              (in_RCX,(Vector *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),
               (SelectionVector *)in_stack_ffffffffffffffd0,sVar9);
    if (iVar3 != 0) {
      plVar4 = FlatVector::GetData<duckdb::list_entry_t>((Vector *)0x2e1ec33);
      for (uVar7 = 0; uVar7 < in_R8D; uVar7 = uVar7 + 1) {
        register0x00000000 = SelectionVector::get_index((SelectionVector *)in_RCX,uVar7);
        plVar4[register0x00000000].offset = iVar3 + plVar4[register0x00000000].offset;
      }
      Vector::Verify(in_RDX,(SelectionVector *)in_RCX,(ulong)in_R8D);
    }
    break;
  case STRUCT:
    this_01 = &StructVector::GetEntries(in_stack_fffffffffffffee8)->
               super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
    ;
    count_00 = (sel_t)(stack0xffffffffffffff98 >> 0x20);
    StructVector::GetEntries(in_stack_fffffffffffffee8);
    ValidityFillLoop(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                     count_00);
    uVar7 = 0;
    while (uVar8 = uVar7,
          sVar2 = ::std::
                  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                  ::size(this_01), uVar7 < sVar2) {
      vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>::
      operator[](in_stack_fffffffffffffef0,(size_type)in_stack_fffffffffffffee8);
      unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                 in_stack_fffffffffffffef0);
      vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>::
      operator[](in_stack_fffffffffffffef0,(size_type)in_stack_fffffffffffffee8);
      unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                 in_stack_fffffffffffffef0);
      FillSwitch(in_RSI,in_RDX,in_RCX,(SelectionVector *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),
                 (sel_t)((ulong)this_01 >> 0x20));
      uVar7 = uVar8 + 1;
    }
    break;
  case VARCHAR:
    TemplatedFillLoop<duckdb::string_t>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,sVar9);
    StringVector::AddHeapReference(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    break;
  default:
    uVar5 = __cxa_allocate_exception(0x10);
    paVar6 = &aStack_89;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(asStack_88,"Unimplemented type for case expression: %s",paVar6);
    Vector::GetType(in_RDX);
    LogicalType::ToString(in_stack_000004f8);
    NotImplementedException::
    NotImplementedException<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    __cxa_throw(uVar5,&NotImplementedException::typeinfo,
                NotImplementedException::~NotImplementedException);
  case UINT128:
    TemplatedFillLoop<duckdb::uhugeint_t>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,sVar9);
    break;
  case INT128:
    TemplatedFillLoop<duckdb::hugeint_t>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,sVar9);
  }
  return;
}

Assistant:

void ExpressionExecutor::FillSwitch(Vector &vector, Vector &result, const SelectionVector &sel, sel_t count) {
	switch (result.GetType().InternalType()) {
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
		TemplatedFillLoop<int8_t>(vector, result, sel, count);
		break;
	case PhysicalType::INT16:
		TemplatedFillLoop<int16_t>(vector, result, sel, count);
		break;
	case PhysicalType::INT32:
		TemplatedFillLoop<int32_t>(vector, result, sel, count);
		break;
	case PhysicalType::INT64:
		TemplatedFillLoop<int64_t>(vector, result, sel, count);
		break;
	case PhysicalType::UINT8:
		TemplatedFillLoop<uint8_t>(vector, result, sel, count);
		break;
	case PhysicalType::UINT16:
		TemplatedFillLoop<uint16_t>(vector, result, sel, count);
		break;
	case PhysicalType::UINT32:
		TemplatedFillLoop<uint32_t>(vector, result, sel, count);
		break;
	case PhysicalType::UINT64:
		TemplatedFillLoop<uint64_t>(vector, result, sel, count);
		break;
	case PhysicalType::INT128:
		TemplatedFillLoop<hugeint_t>(vector, result, sel, count);
		break;
	case PhysicalType::UINT128:
		TemplatedFillLoop<uhugeint_t>(vector, result, sel, count);
		break;
	case PhysicalType::FLOAT:
		TemplatedFillLoop<float>(vector, result, sel, count);
		break;
	case PhysicalType::DOUBLE:
		TemplatedFillLoop<double>(vector, result, sel, count);
		break;
	case PhysicalType::INTERVAL:
		TemplatedFillLoop<interval_t>(vector, result, sel, count);
		break;
	case PhysicalType::VARCHAR:
		TemplatedFillLoop<string_t>(vector, result, sel, count);
		StringVector::AddHeapReference(result, vector);
		break;
	case PhysicalType::STRUCT: {
		auto &vector_entries = StructVector::GetEntries(vector);
		auto &result_entries = StructVector::GetEntries(result);
		ValidityFillLoop(vector, result, sel, count);
		D_ASSERT(vector_entries.size() == result_entries.size());
		for (idx_t i = 0; i < vector_entries.size(); i++) {
			FillSwitch(*vector_entries[i], *result_entries[i], sel, count);
		}
		break;
	}
	case PhysicalType::LIST: {
		idx_t offset = ListVector::GetListSize(result);
		auto &list_child = ListVector::GetEntry(vector);
		ListVector::Append(result, list_child, ListVector::GetListSize(vector));

		// all the false offsets need to be incremented by true_child.count
		TemplatedFillLoop<list_entry_t>(vector, result, sel, count);
		if (offset == 0) {
			break;
		}

		auto result_data = FlatVector::GetData<list_entry_t>(result);
		for (idx_t i = 0; i < count; i++) {
			auto result_idx = sel.get_index(i);
			result_data[result_idx].offset += offset;
		}

		Vector::Verify(result, sel, count);
		break;
	}
	default:
		throw NotImplementedException("Unimplemented type for case expression: %s", result.GetType().ToString());
	}
}